

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

void __thiscall cmCTestMultiProcessHandler::UpdateCostData(cmCTestMultiProcessHandler *this)

{
  PropertiesMap *__x;
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  istream *piVar4;
  ostream *poVar5;
  mapped_type *ppcVar6;
  _Base_ptr p_Var7;
  string *f;
  pointer pbVar8;
  int index;
  cmCTestMultiProcessHandler *local_510;
  double local_508;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  string fname;
  string tmpout;
  string line;
  PropertiesMap temp;
  string name;
  ofstream fout;
  ifstream fin;
  
  local_510 = this;
  cmCTest::GetCostDataFile_abi_cxx11_(&fname,this->CTest);
  std::operator+(&tmpout,&fname,".tmp");
  std::ofstream::ofstream(&fout);
  std::ofstream::open((char *)&fout,(_Ios_Openmode)tmpout._M_dataplus._M_p);
  __x = &local_510->Properties;
  std::
  _Rb_tree<int,_std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>,_std::_Select1st<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
  ::_Rb_tree((_Rb_tree<int,_std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>,_std::_Select1st<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              *)&temp,(_Rb_tree<int,_std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>,_std::_Select1st<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                       *)__x);
  bVar2 = cmsys::SystemTools::FileExists(&fname);
  if (bVar2) {
    std::ifstream::ifstream(&fin);
    std::ifstream::open((char *)&fin,(_Ios_Openmode)fname._M_dataplus._M_p);
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&fin,(string *)&line);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      bVar2 = std::operator==(&line,"---");
      if (bVar2) break;
      cmsys::SystemTools::SplitString(&parts,&line,' ',false);
      if ((ulong)((long)parts.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)parts.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 0x41) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&parts);
        break;
      }
      std::__cxx11::string::string
                ((string *)&name,
                 (string *)
                 parts.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      pbVar8 = parts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar3 = atoi(parts.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
      local_508 = atof(pbVar8[2]._M_dataplus._M_p);
      index = SearchByName(local_510,&name);
      if (index == -1) {
        poVar5 = std::operator<<(&fout.super_basic_ostream<char,_std::char_traits<char>_>,
                                 (string *)&name);
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(float)local_508);
        std::operator<<(poVar5,"\n");
      }
      else {
        poVar5 = std::operator<<(&fout.super_basic_ostream<char,_std::char_traits<char>_>,
                                 (string *)&name);
        poVar5 = std::operator<<(poVar5," ");
        ppcVar6 = std::
                  map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                  ::operator[](&__x->
                                super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                               ,&index);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(*ppcVar6)->PreviousRuns);
        poVar5 = std::operator<<(poVar5," ");
        ppcVar6 = std::
                  map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                  ::operator[](&__x->
                                super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                               ,&index);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(*ppcVar6)->Cost);
        std::operator<<(poVar5,"\n");
        std::
        _Rb_tree<int,_std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>,_std::_Select1st<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
        ::erase((_Rb_tree<int,_std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>,_std::_Select1st<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                 *)&temp,&index);
      }
      std::__cxx11::string::~string((string *)&name);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&parts);
    }
    std::ifstream::close();
    cmsys::SystemTools::RemoveFile(&fname);
    std::__cxx11::string::~string((string *)&line);
    std::ifstream::~ifstream(&fin);
  }
  for (p_Var7 = temp.
                super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 !=
      &temp.
       super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
       ._M_t._M_impl.super__Rb_tree_header; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    poVar5 = std::operator<<(&fout.super_basic_ostream<char,_std::char_traits<char>_>,
                             (string *)p_Var7[1]._M_parent);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(int *)&p_Var7[1]._M_parent[10]._M_left);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,*(float *)((long)&p_Var7[1]._M_parent[10]._M_parent + 4));
    std::operator<<(poVar5,"\n");
  }
  std::operator<<(&fout.super_basic_ostream<char,_std::char_traits<char>_>,"---\n");
  pbVar1 = (local_510->Failed->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar8 = (local_510->Failed->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar1; pbVar8 = pbVar8 + 1) {
    poVar5 = std::operator<<(&fout.super_basic_ostream<char,_std::char_traits<char>_>,
                             (string *)pbVar8);
    std::operator<<(poVar5,"\n");
  }
  std::ofstream::close();
  cmSystemTools::RenameFile(&tmpout,&fname);
  std::
  _Rb_tree<int,_std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>,_std::_Select1st<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>,_std::_Select1st<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
               *)&temp);
  std::ofstream::~ofstream(&fout);
  std::__cxx11::string::~string((string *)&tmpout);
  std::__cxx11::string::~string((string *)&fname);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::UpdateCostData()
{
  std::string fname = this->CTest->GetCostDataFile();
  std::string tmpout = fname + ".tmp";
  cmsys::ofstream fout;
  fout.open(tmpout.c_str());

  PropertiesMap temp = this->Properties;

  if (cmSystemTools::FileExists(fname)) {
    cmsys::ifstream fin;
    fin.open(fname.c_str());

    std::string line;
    while (std::getline(fin, line)) {
      if (line == "---") {
        break;
      }
      std::vector<std::string> parts = cmSystemTools::SplitString(line, ' ');
      // Format: <name> <previous_runs> <avg_cost>
      if (parts.size() < 3) {
        break;
      }

      std::string name = parts[0];
      int prev = atoi(parts[1].c_str());
      float cost = static_cast<float>(atof(parts[2].c_str()));

      int index = this->SearchByName(name);
      if (index == -1) {
        // This test is not in memory. We just rewrite the entry
        fout << name << " " << prev << " " << cost << "\n";
      } else {
        // Update with our new average cost
        fout << name << " " << this->Properties[index]->PreviousRuns << " "
             << this->Properties[index]->Cost << "\n";
        temp.erase(index);
      }
    }
    fin.close();
    cmSystemTools::RemoveFile(fname);
  }

  // Add all tests not previously listed in the file
  for (auto const& i : temp) {
    fout << i.second->Name << " " << i.second->PreviousRuns << " "
         << i.second->Cost << "\n";
  }

  // Write list of failed tests
  fout << "---\n";
  for (std::string const& f : *this->Failed) {
    fout << f << "\n";
  }
  fout.close();
  cmSystemTools::RenameFile(tmpout, fname);
}